

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::anon_unknown_0::SignCaseInstance::getInputValues
          (SignCaseInstance *this,int numValues,void **values)

{
  float fVar1;
  float fVar2;
  DataType dataType;
  pointer pSVar3;
  void *__s;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  deUint32 dVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  float fVar15;
  int iVar17;
  undefined1 auVar16 [16];
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar23;
  undefined1 auVar22 [16];
  Random rnd;
  deRandom local_78;
  int local_68 [8];
  float local_48 [6];
  
  local_48[0] = -2.0;
  local_48[1] = 2.0;
  local_48[2] = -10000.0;
  local_48[3] = 10000.0;
  local_48[4] = -1e+08;
  local_48[5] = 1e+08;
  local_68[0] = -0x80;
  local_68[1] = 0x7f;
  local_68[2] = -0x8000;
  local_68[3] = 0x7fff;
  local_68[4] = -0x80000000;
  local_68[5] = 0x7fffffff;
  dVar7 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  deRandom_init(&local_78,dVar7 ^ 0x324);
  pSVar3 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dataType = (pSVar3->varType).m_data.basic.type;
  uVar13 = (ulong)*(uint *)((long)&(pSVar3->varType).m_data + 4);
  iVar8 = glu::getDataTypeScalarSize(dataType);
  auVar6 = _DAT_00ac4b80;
  auVar5 = _DAT_00ac4b70;
  auVar4 = _DAT_00ac4b30;
  __s = *values;
  lVar10 = (long)iVar8;
  if (dataType - TYPE_FLOAT < 4) {
    if (iVar8 != 0) {
      uVar9 = lVar10 + 0x3fffffffffffffffU & 0x3fffffffffffffff;
      uVar11 = (uint)(lVar10 + 0x3fffffffffffffffU);
      auVar16._8_4_ = (int)uVar9;
      auVar16._0_8_ = uVar9;
      auVar16._12_4_ = (int)(uVar9 >> 0x20);
      lVar12 = 0;
      auVar16 = auVar16 ^ _DAT_00ac4b80;
      do {
        auVar19._8_4_ = (int)lVar12;
        auVar19._0_8_ = lVar12;
        auVar19._12_4_ = (int)((ulong)lVar12 >> 0x20);
        auVar22 = (auVar19 | auVar4) ^ auVar6;
        iVar14 = auVar16._0_4_;
        iVar17 = auVar16._4_4_;
        iVar18 = auVar16._12_4_;
        if ((bool)(~(auVar22._4_4_ == iVar17 && iVar14 < auVar22._0_4_ || iVar17 < auVar22._4_4_) &
                  1)) {
          *(undefined4 *)((long)__s + lVar12 * 4) = 0x3f800000;
        }
        if ((auVar22._12_4_ != iVar18 || auVar22._8_4_ <= auVar16._8_4_) && auVar22._12_4_ <= iVar18
           ) {
          *(undefined4 *)((long)__s + lVar12 * 4 + 4) = 0x3f800000;
        }
        auVar22 = (auVar19 | auVar5) ^ auVar6;
        iVar23 = auVar22._4_4_;
        if (iVar23 <= iVar17 && (iVar23 != iVar17 || auVar22._0_4_ <= iVar14)) {
          *(undefined4 *)((long)__s + lVar12 * 4 + 8) = 0x3f800000;
          *(undefined4 *)((long)__s + lVar12 * 4 + 0xc) = 0x3f800000;
        }
        lVar12 = lVar12 + 4;
      } while ((uVar9 - (uVar11 & 3)) + 4 != lVar12);
      lVar12 = 0;
      do {
        auVar20._8_4_ = (int)lVar12;
        auVar20._0_8_ = lVar12;
        auVar20._12_4_ = (int)((ulong)lVar12 >> 0x20);
        auVar22 = (auVar20 | auVar4) ^ auVar6;
        if ((bool)(~(auVar22._4_4_ == iVar17 && iVar14 < auVar22._0_4_ || iVar17 < auVar22._4_4_) &
                  1)) {
          *(undefined4 *)((long)__s + lVar12 * 4) = 0xbf800000;
        }
        if ((auVar22._12_4_ != iVar18 || auVar22._8_4_ <= auVar16._8_4_) && auVar22._12_4_ <= iVar18
           ) {
          *(undefined4 *)((long)__s + lVar12 * 4 + 4) = 0xbf800000;
        }
        auVar22 = (auVar20 | auVar5) ^ auVar6;
        iVar23 = auVar22._4_4_;
        if (iVar23 <= iVar17 && (iVar23 != iVar17 || auVar22._0_4_ <= iVar14)) {
          *(undefined4 *)((long)__s + lVar12 * 4 + 8) = 0xbf800000;
          *(undefined4 *)((long)__s + lVar12 * 4 + 0xc) = 0xbf800000;
        }
        lVar12 = lVar12 + 4;
      } while ((uVar9 - (uVar11 & 3)) + 4 != lVar12);
      memset(__s,0,lVar10 << 2);
    }
    uVar11 = (numValues + -3) * iVar8;
    if (0 < (int)uVar11) {
      fVar1 = local_48[uVar13 * 2];
      fVar2 = local_48[uVar13 * 2 + 1];
      uVar13 = 0;
      do {
        fVar15 = deRandom_getFloat(&local_78);
        *(float *)((long)__s + uVar13 * 4 + (long)(iVar8 * 3) * 4) =
             fVar15 * (fVar2 - fVar1) + fVar1;
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
  }
  else {
    if (iVar8 != 0) {
      uVar9 = lVar10 + 0x3fffffffffffffffU & 0x3fffffffffffffff;
      auVar22._8_4_ = (int)uVar9;
      auVar22._0_8_ = uVar9;
      auVar22._12_4_ = (int)(uVar9 >> 0x20);
      lVar12 = 0;
      auVar22 = auVar22 ^ _DAT_00ac4b80;
      do {
        auVar21._8_4_ = (int)lVar12;
        auVar21._0_8_ = lVar12;
        auVar21._12_4_ = (int)((ulong)lVar12 >> 0x20);
        auVar16 = (auVar21 | auVar4) ^ auVar6;
        iVar14 = auVar22._4_4_;
        if ((bool)(~(auVar16._4_4_ == iVar14 && auVar22._0_4_ < auVar16._0_4_ ||
                    iVar14 < auVar16._4_4_) & 1)) {
          *(undefined4 *)((long)__s + lVar12 * 4) = 1;
        }
        if ((auVar16._12_4_ != auVar22._12_4_ || auVar16._8_4_ <= auVar22._8_4_) &&
            auVar16._12_4_ <= auVar22._12_4_) {
          *(undefined4 *)((long)__s + lVar12 * 4 + 4) = 1;
        }
        auVar21 = (auVar21 | auVar5) ^ auVar6;
        iVar17 = auVar21._4_4_;
        if (iVar17 <= iVar14 && (iVar17 != iVar14 || auVar21._0_4_ <= auVar22._0_4_)) {
          *(undefined4 *)((long)__s + lVar12 * 4 + 8) = 1;
          *(undefined4 *)((long)__s + lVar12 * 4 + 0xc) = 1;
        }
        lVar12 = lVar12 + 4;
      } while ((uVar9 - ((uint)(lVar10 + 0x3fffffffffffffffU) & 3)) + 4 != lVar12);
      memset(__s,0,lVar10 << 2);
    }
    uVar11 = (numValues + -3) * iVar8;
    if (0 < (int)uVar11) {
      iVar14 = local_68[uVar13 * 2];
      iVar17 = local_68[uVar13 * 2 + 1];
      uVar13 = 0;
      do {
        dVar7 = deRandom_getUint32(&local_78);
        if (iVar17 != 0x7fffffff || iVar14 != -0x80000000) {
          dVar7 = dVar7 % ((iVar17 - iVar14) + 1U) + iVar14;
        }
        *(deUint32 *)((long)__s + uVar13 * 4 + (long)(iVar8 * 3) * 4) = dVar7;
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 floatRanges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e4f,		1e4f),	// mediump	- note: may end up as inf
			Vec2(-1e8f,		1e8f)	// highp	- note: may end up as inf
		};
		const IVec2 intRanges[] =
		{
			IVec2(-(1<<7),		(1<<7)-1),
			IVec2(-(1<<15),		(1<<15)-1),
			IVec2(0x80000000,	0x7fffffff)
		};

		de::Random				rnd			(deStringHash(m_name) ^ 0x324u);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);

		if (glu::isDataTypeFloatOrVec(type))
		{
			// Special cases.
			std::fill((float*)values[0], (float*)values[0] + scalarSize, +1.0f);
			std::fill((float*)values[0], (float*)values[0] + scalarSize, -1.0f);
			std::fill((float*)values[0], (float*)values[0] + scalarSize,  0.0f);
			fillRandomScalars(rnd, floatRanges[precision].x(), floatRanges[precision].y(), (float*)values[0] + scalarSize*3, (numValues-3)*scalarSize);
		}
		else
		{
			std::fill((int*)values[0], (int*)values[0] + scalarSize, +1);
			std::fill((int*)values[0], (int*)values[0] + scalarSize, -1);
			std::fill((int*)values[0], (int*)values[0] + scalarSize,  0);
			fillRandomScalars(rnd, intRanges[precision].x(), intRanges[precision].y(), (int*)values[0] + scalarSize*3, (numValues-3)*scalarSize);
		}
	}